

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.h
# Opt level: O2

time_double
time_function<unsigned_long,unsigned_long>
          (random_numerators<unsigned_long> *vals,unsigned_long denom,
          pFuncToTime<unsigned_long,_unsigned_long> timeFunc)

{
  undefined1 auVar1 [16];
  uint64_t uVar2;
  undefined1 auVar3 [16];
  time_double tVar4;
  timer t;
  unsigned_long local_40;
  timer local_38;
  
  local_40 = denom;
  timer::start(&local_38);
  uVar2 = sum_quotients<unsigned_long,unsigned_long>(vals,&local_40);
  timer::stop(&local_38);
  auVar1 = vpsubq_avx((undefined1  [16])local_38.end_time,(undefined1  [16])local_38.start_time);
  auVar3 = vpmullq_avx512vl(auVar1,_DAT_00106020);
  auVar1 = vpshufd_avx(auVar3,0xee);
  auVar1 = vpaddq_avx(auVar1,auVar3);
  tVar4.result = uVar2;
  tVar4.time = auVar1._0_8_;
  return tVar4;
}

Assistant:

NOINLINE static time_double time_function(
    const random_numerators<IntT> &vals, DenomT denom, pFuncToTime<IntT, DenomT> timeFunc) {
    time_double tresult;

    timer t;
    t.start();
    tresult.result = timeFunc(vals, denom);
    t.stop();
    tresult.time = t.duration_nano();
    return tresult;
}